

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
reconstruct_chunk_table
          (exr_const_context_t_conflict ctxt,exr_const_priv_part_t part,uint64_t *chunktable)

{
  exr_priv_part_t *pp_Var1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  exr_const_context_t_conflict ctxt_00;
  uint64_t *puVar5;
  exr_result_t eVar6;
  int iVar7;
  int iVar8;
  exr_const_priv_part_t p_Var9;
  int partnum;
  long lVar10;
  long lVar11;
  uint64_t offset;
  int iVar12;
  size_t __n;
  ulong uVar13;
  ulong uVar14;
  uint64_t offset_start;
  uint64_t *curctable;
  priv_chunk_leader leader;
  uint *in_stack_ffffffffffffff48;
  ulong local_a8;
  uint local_9c;
  exr_const_priv_part_t local_98;
  exr_const_context_t_conflict local_90;
  uint64_t local_88;
  uint64_t *local_80;
  int local_74;
  uint64_t *local_70;
  ulong local_68;
  uint64_t *local_60;
  size_t local_58;
  priv_chunk_leader local_50;
  
  pp_Var1 = ctxt->parts;
  uVar13 = pp_Var1[(long)ctxt->num_parts + -1]->chunk_table_offset +
           (long)pp_Var1[(long)ctxt->num_parts + -1]->chunk_count * 8;
  if (*pp_Var1 == part) {
    lVar11 = 0;
  }
  else {
    lVar10 = 0;
    do {
      lVar11 = lVar10 + 1;
      lVar4 = lVar10 + 1;
      lVar10 = lVar11;
    } while (pp_Var1[lVar4] != part);
  }
  local_68 = 0xffffffffffffffff;
  if (0 < ctxt->file_size) {
    local_68 = ctxt->file_size;
  }
  partnum = (int)lVar11;
  local_a8 = uVar13;
  local_98 = part;
  local_90 = ctxt;
  local_70 = chunktable;
  if (partnum != 0) {
    p_Var9 = pp_Var1[partnum - 1U];
    eVar6 = extract_chunk_table(ctxt,p_Var9,&local_60,&local_88);
    ctxt = local_90;
    if (eVar6 != 0) {
      return eVar6;
    }
    if (0 < (long)p_Var9->chunk_count) {
      lVar11 = 0;
      uVar14 = uVar13;
      do {
        uVar2 = local_60[lVar11];
        uVar13 = uVar14;
        if (uVar2 < local_68) {
          uVar13 = uVar2;
        }
        if (uVar2 <= uVar14) {
          uVar13 = uVar14;
        }
        lVar11 = lVar11 + 1;
        uVar14 = uVar13;
      } while (p_Var9->chunk_count != lVar11);
    }
    local_88 = uVar13;
    eVar6 = extract_chunk_leader(local_90,p_Var9,partnum - 1U,uVar13,&local_a8,&local_50);
    if (eVar6 != 0) {
      return eVar6;
    }
  }
  p_Var9 = local_98;
  __n = (long)local_98->chunk_count << 3;
  local_80 = (uint64_t *)(*ctxt->alloc_fn)(__n);
  if (local_80 == (uint64_t *)0x0) {
    iVar12 = 1;
  }
  else {
    iVar12 = 0;
    local_60 = local_80;
    local_58 = __n;
    memset(local_80,0,__n);
    uVar13 = (ulong)(uint)p_Var9->chunk_count;
    offset = local_88;
    if (0 < p_Var9->chunk_count) {
      iVar8 = -1;
      uVar14 = 0;
      iVar12 = 0;
      do {
        local_74 = iVar12;
        ctxt_00 = local_90;
        uVar2 = local_70[uVar14];
        offset = local_a8;
        if (uVar2 < local_68) {
          offset = uVar2;
        }
        if (uVar2 < local_a8) {
          offset = local_a8;
        }
        uVar13 = (ulong)(uint)((int)uVar13 + iVar8);
        if (p_Var9->lineorder != EXR_LINEORDER_DECREASING_Y) {
          uVar13 = uVar14 & 0xffffffff;
        }
        local_a8 = offset;
        iVar7 = extract_chunk_leader(local_90,p_Var9,partnum,offset,&local_a8,&local_50);
        iVar12 = (int)uVar13;
        if (iVar7 == 0) {
          if ((p_Var9->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
            lVar11 = (long)(p_Var9->data_window).min.y;
            uVar13 = (local_50.field_1.scanline_y - lVar11) / (long)p_Var9->lines_per_chunk;
            if ((((long)uVar13 < 0) || (iVar12 != (int)uVar13)) ||
               (iVar7 = 0, (long)p_Var9->chunk_count <= (long)uVar13)) {
              in_stack_ffffffffffffff48 =
                   (uint *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                    (int)p_Var9->lines_per_chunk);
              iVar7 = (*ctxt_00->print_error)
                                (ctxt_00,0x16,
                                 "Invalid chunk index: %ld reading scanline %d (datawindow min %d) with lines per chunk %d"
                                 ,uVar13,(long)local_50.field_1.scanline_y,lVar11,
                                 in_stack_ffffffffffffff48);
              p_Var9 = local_98;
            }
          }
          else {
            local_9c = 0;
            in_stack_ffffffffffffff48 = &local_9c;
            iVar7 = validate_and_compute_tile_chunk_off
                              (ctxt_00,local_98,local_50.field_1.scanline_y,
                               local_50.field_1.field_1.tile_y,local_50.field_1.field_1.level_x,
                               local_50.field_1.field_1.level_y,(int32_t *)in_stack_ffffffffffffff48
                              );
            uVar13 = (ulong)local_9c;
            p_Var9 = local_98;
          }
        }
        iVar3 = local_74;
        if (local_74 == 0) {
          iVar3 = iVar7;
        }
        iVar12 = local_74;
        if (iVar7 != 0) {
          offset = 0;
          iVar12 = iVar3;
        }
        if (((-1 < (int)uVar13) && ((int)uVar13 < p_Var9->chunk_count)) &&
           (local_80[uVar13 & 0xffffffff] == 0)) {
          local_80[uVar13 & 0xffffffff] = offset;
        }
        uVar14 = uVar14 + 1;
        uVar13 = (ulong)p_Var9->chunk_count;
        iVar8 = iVar8 + -1;
      } while ((long)uVar14 < (long)uVar13);
    }
    puVar5 = local_80;
    local_88 = offset;
    if (iVar12 == 0) {
      memcpy(local_70,local_80,local_58);
    }
    (*local_90->free_fn)(puVar5);
  }
  return iVar12;
}

Assistant:

static exr_result_t
reconstruct_chunk_table (
    exr_const_context_t ctxt, exr_const_priv_part_t part, uint64_t* chunktable)
{
    exr_result_t          rv          = EXR_ERR_SUCCESS;
    exr_result_t          firstfailrv = EXR_ERR_SUCCESS;
    uint64_t              offset_start, chunk_start, max_offset;
    uint64_t*             curctable;
    exr_const_priv_part_t curpart = NULL;
    int                   found_ci, computed_ci, partnum = 0;
    size_t                chunkbytes;

    curpart      = ctxt->parts[ctxt->num_parts - 1];
    offset_start = curpart->chunk_table_offset;
    offset_start += sizeof (uint64_t) * (uint64_t) curpart->chunk_count;

    curpart = ctxt->parts[partnum];
    while (curpart != part)
    {
        ++partnum;
        curpart = ctxt->parts[partnum];
    }

    max_offset = (uint64_t) -1;
    if (ctxt->file_size > 0) max_offset = (uint64_t) ctxt->file_size;

    // for multi-part, need to start at the first part and extract everything, then
    // work our way back up to this one, then grab the end of the previous part
    if (partnum > 0)
    {
        curpart = ctxt->parts[partnum - 1];
        rv      = extract_chunk_table (ctxt, curpart, &curctable, &chunk_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        chunk_start = offset_start;
        for (int ci = 0; ci < curpart->chunk_count; ++ci)
        {
            if (curctable[ci] > chunk_start && curctable[ci] < max_offset)
                chunk_start = curctable[ci];
        }

        rv = extract_chunk_size (
            ctxt, curpart, partnum - 1, chunk_start, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    chunkbytes = (size_t) part->chunk_count * sizeof (uint64_t);
    curctable  = (uint64_t*) ctxt->alloc_fn (chunkbytes);
    if (!curctable) return EXR_ERR_OUT_OF_MEMORY;

    memset (curctable, 0, chunkbytes);
    for (int ci = 0; ci < part->chunk_count; ++ci)
    {
        if (chunktable[ci] >= offset_start && chunktable[ci] < max_offset)
        {
            offset_start = chunktable[ci];
        }
        chunk_start = offset_start;
        computed_ci = ci;
        if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
            computed_ci = part->chunk_count - (ci + 1);
        found_ci = computed_ci;

        rv = read_and_validate_chunk_leader (
            ctxt, part, partnum, chunk_start, &found_ci, &offset_start);
        if (rv != EXR_ERR_SUCCESS)
        {
            chunk_start = 0;
            if (firstfailrv == EXR_ERR_SUCCESS) firstfailrv = rv;
        }

        if (found_ci >= 0 && found_ci < part->chunk_count)
        {
            if (curctable[found_ci] == 0) curctable[found_ci] = chunk_start;
        }
    }
    if (firstfailrv == EXR_ERR_SUCCESS)
        memcpy (chunktable, curctable, chunkbytes);
    ctxt->free_fn (curctable);

    return firstfailrv;
}